

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortFactory.cpp
# Opt level: O2

BasePort * PortFactory(char *args,ostream *debugStream)

{
  bool bVar1;
  EthUdpPort *this;
  ostream *poVar2;
  char *pcVar3;
  bool fwBridge;
  int portNumber;
  PortType portType;
  string IPaddr;
  bool local_39;
  int local_38;
  PortType local_34;
  string local_30;
  
  local_38 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"169.254.0.100",(allocator<char> *)&local_34);
  local_39 = false;
  local_34 = BasePort::DefaultPortType();
  bVar1 = BasePort::ParseOptions(args,&local_34,&local_38,&local_30,&local_39,(ostream *)&std::cerr)
  ;
  if (!bVar1) {
    poVar2 = std::operator<<(debugStream,"PortFactory: Failed to parse option: ");
    poVar2 = std::operator<<(poVar2,args);
    goto LAB_0010bcc7;
  }
  switch(local_34) {
  case PORT_FIREWIRE:
    this = (EthUdpPort *)operator_new(0x4f8);
    FirewirePort::FirewirePort((FirewirePort *)this,local_38,debugStream);
    goto LAB_0010bcd2;
  case PORT_ETH_UDP:
    this = (EthUdpPort *)operator_new(0x570);
    EthUdpPort::EthUdpPort(this,local_38,&local_30,local_39,debugStream,(EthCallbackType)0x0);
    goto LAB_0010bcd2;
  case PORT_ETH_RAW:
    pcVar3 = "PortFactory: Raw Ethernet not available (set Amp1394_HAS_PCAP in CMake)";
    break;
  case PORT_ZYNQ_EMIO:
    pcVar3 = "PortFactory: Zynq EMIO not available";
    break;
  default:
    pcVar3 = "PortFactory: Unsupported port type";
  }
  poVar2 = std::operator<<(debugStream,pcVar3);
LAB_0010bcc7:
  std::endl<char,std::char_traits<char>>(poVar2);
  this = (EthUdpPort *)0x0;
LAB_0010bcd2:
  std::__cxx11::string::~string((string *)&local_30);
  return (BasePort *)this;
}

Assistant:

BasePort * PortFactory(const char * args, std::ostream & debugStream)
{
    BasePort * port = 0;
    int portNumber = 0;
    std::string IPaddr = ETH_UDP_DEFAULT_IP;
    bool fwBridge = false;

    BasePort::PortType portType = BasePort::DefaultPortType();

    if (!BasePort::ParseOptions(args, portType, portNumber, IPaddr, fwBridge)) {
        debugStream << "PortFactory: Failed to parse option: " << args << std::endl;
        return port;
    }

    switch (portType) {

    case BasePort::PORT_FIREWIRE:
#if Amp1394_HAS_RAW1394
        port = new FirewirePort(portNumber, debugStream);
#else
        debugStream << "PortFactory: FireWire not available (set Amp1394_HAS_RAW1394 in CMake)" << std::endl;
#endif
        break;

    case BasePort::PORT_ETH_UDP:
        port = new EthUdpPort(portNumber, IPaddr, fwBridge, debugStream);
        break;
    
    case BasePort::PORT_ETH_RAW:
#if Amp1394_HAS_PCAP
        port = new EthRawPort(portNumber, fwBridge, debugStream);
#else
        debugStream << "PortFactory: Raw Ethernet not available (set Amp1394_HAS_PCAP in CMake)" << std::endl;
#endif
        break;

    case BasePort::PORT_ZYNQ_EMIO:
#if Amp1394_HAS_EMIO
        port = new ZynqEmioPort(portNumber, debugStream);
#else
        debugStream << "PortFactory: Zynq EMIO not available" << std::endl;
#endif
        break;

    default:
        debugStream << "PortFactory: Unsupported port type" << std::endl;
        break;
    }
    
    return port;
}